

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<wabt::ModuleField>::clear(intrusive_list<wabt::ModuleField> *this)

{
  ModuleField *pMVar1;
  ModuleField *next;
  ModuleField *iter;
  intrusive_list<wabt::ModuleField> *this_local;
  
  pMVar1 = this->first_;
  while (next = pMVar1, next != (ModuleField *)0x0) {
    pMVar1 = (next->super_intrusive_list_base<wabt::ModuleField>).next_;
    if (next != (ModuleField *)0x0) {
      (*next->_vptr_ModuleField[1])();
    }
  }
  this->last_ = (ModuleField *)0x0;
  this->first_ = (ModuleField *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void intrusive_list<T>::clear() noexcept {
  for (T* iter = first_; iter;) {
    T* next = iter->next_;
    delete iter;
    iter = next;
  }
  first_ = last_ = nullptr;
  size_ = 0;
}